

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::cpp::IsLazilyInitializedFile(cpp *this,string_view filename)

{
  int iVar1;
  char *__s2;
  size_type __rlen;
  bool bVar2;
  
  bVar2 = false;
  switch(this) {
  case (cpp *)0x20:
    __s2 = "google/protobuf/descriptor.proto";
    break;
  case (cpp *)0x21:
    __s2 = "net/proto2/proto/descriptor.proto";
    break;
  case (cpp *)0x22:
    __s2 = "google/protobuf/cpp_features.proto";
    break;
  default:
    goto switchD_00229868_caseD_23;
  case (cpp *)0x27:
    __s2 = "third_party/protobuf/cpp_features.proto";
    this = (cpp *)0x27;
  }
  iVar1 = bcmp((void *)filename._M_len,__s2,(size_t)this);
  bVar2 = iVar1 == 0;
switchD_00229868_caseD_23:
  return bVar2;
}

Assistant:

bool IsLazilyInitializedFile(absl::string_view filename) {
  if (filename == "third_party/protobuf/cpp_features.proto" ||
      filename == "google/protobuf/cpp_features.proto") {
    return true;
  }
  return filename == "net/proto2/proto/descriptor.proto" ||
         filename == "google/protobuf/descriptor.proto";
}